

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

void fts5PoslistOffsetsCallback(Fts5Index *pUnused,void *pContext,u8 *pChunk,int nChunk)

{
  int iVar1;
  int iVar2;
  undefined8 in_RAX;
  long lVar3;
  long lVar4;
  int iVar5;
  uint uVar6;
  ulong uVar7;
  undefined8 uStack_38;
  
  if (0 < nChunk) {
    uVar7 = 0;
    uStack_38 = in_RAX;
    do {
      iVar1 = sqlite3Fts5GetVarint32(pChunk + uVar7,(u32 *)((long)&uStack_38 + 4));
      iVar2 = *(int *)((long)pContext + 0x10);
      iVar5 = uStack_38._4_4_ + iVar2 + -2;
      *(int *)((long)pContext + 0x10) = iVar5;
      lVar3 = (long)**(int **)((long)pContext + 8);
      if (0 < lVar3) {
        lVar4 = 0;
        do {
          if ((*(int **)((long)pContext + 8))[lVar4 + 1] == iVar5) {
            iVar2 = sqlite3Fts5PutVarint
                              ((uchar *)((long)(int)(*pContext)[1] + **pContext),
                               (long)((uStack_38._4_4_ + iVar2) - *(int *)((long)pContext + 0x14)));
            *(int *)(*pContext + 8) = *(int *)(*pContext + 8) + iVar2;
            *(int *)((long)pContext + 0x14) = iVar5;
            break;
          }
          lVar4 = lVar4 + 1;
        } while (lVar3 != lVar4);
      }
      uVar6 = (int)uVar7 + iVar1;
      uVar7 = (ulong)uVar6;
    } while ((int)uVar6 < nChunk);
  }
  return;
}

Assistant:

static void fts5PoslistOffsetsCallback(
  Fts5Index *pUnused, 
  void *pContext, 
  const u8 *pChunk, int nChunk
){
  PoslistOffsetsCtx *pCtx = (PoslistOffsetsCtx*)pContext;
  UNUSED_PARAM(pUnused);
  assert_nc( nChunk>=0 );
  if( nChunk>0 ){
    int i = 0;
    while( i<nChunk ){
      int iVal;
      i += fts5GetVarint32(&pChunk[i], iVal);
      iVal += pCtx->iRead - 2;
      pCtx->iRead = iVal;
      if( fts5IndexColsetTest(pCtx->pColset, iVal) ){
        fts5BufferSafeAppendVarint(pCtx->pBuf, iVal + 2 - pCtx->iWrite);
        pCtx->iWrite = iVal;
      }
    }
  }
}